

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

int Wln_NtkMemUsage(Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  iVar1 = (p->vCos).nCap;
  iVar2 = p->pRanges->vObjs->nSize;
  iVar3 = (p->vCis).nCap;
  iVar4 = (p->vFfs).nCap;
  iVar5 = (p->vRanges).nCap;
  iVar6 = (p->vNameIds).nCap;
  iVar7 = (p->vInstIds).nCap;
  iVar8 = (p->vTravIds).nCap;
  iVar9 = (p->vCopies).nCap;
  iVar10 = (p->vBits).nCap;
  iVar11 = (p->vLevels).nCap;
  iVar12 = (p->vRefs).nCap;
  iVar13 = (p->vFanout).nCap;
  iVar14 = (p->vFaninAttrs).nCap;
  iVar15 = (p->vFaninLists).nCap;
  iVar16 = (p->vTypes).nCap;
  iVar17 = Abc_NamMemUsed(p->pManName);
  return iVar17 + (iVar2 / 4) * 0x14 + iVar16 +
         (iVar1 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + iVar9 + iVar10 + iVar11 + iVar12 +
          iVar13 + iVar14 + iVar15) * 4 + 0x444;
}

Assistant:

int Wln_NtkMemUsage( Wln_Ntk_t * p )
{
    int Mem = sizeof(Wln_Ntk_t);
    Mem += 4 * p->vCis.nCap;
    Mem += 4 * p->vCos.nCap;
    Mem += 4 * p->vFfs.nCap;
    Mem += 1 * p->vTypes.nCap;
    Mem += 4 * p->vRanges.nCap;
    Mem += 4 * p->vNameIds.nCap;
    Mem += 4 * p->vInstIds.nCap;
    Mem += 4 * p->vTravIds.nCap;
    Mem += 4 * p->vCopies.nCap;
    Mem += 4 * p->vBits.nCap;
    Mem += 4 * p->vLevels.nCap;
    Mem += 4 * p->vRefs.nCap;
    Mem += 4 * p->vFanout.nCap;
    Mem += 4 * p->vFaninAttrs.nCap;
    Mem += 4 * p->vFaninLists.nCap;
    Mem += 20 * Hash_IntManEntryNum(p->pRanges);
    Mem += Abc_NamMemUsed(p->pManName);
    return Mem;
}